

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.h
# Opt level: O0

bool __thiscall Initialize::CreateSubDirs(Initialize *this)

{
  byte bVar1;
  vector<int,_std::allocator<int>_> *this_00;
  ulong uVar2;
  Tools *pTVar3;
  size_type sVar4;
  reference pvVar5;
  Logger *pLVar6;
  allocator<char> local_349;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  int local_2a4;
  undefined1 local_2a0 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  path local_260;
  uint local_238 [4];
  int local_228;
  byte local_221;
  int i;
  bool isCreated;
  ifstream file;
  vector<int,_std::allocator<int>_> *dirs;
  Initialize *this_local;
  
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(this_00);
  std::ifstream::ifstream(&i);
  local_221 = 1;
  local_228 = 0;
  while( true ) {
    uVar2 = (ulong)local_228;
    pTVar3 = Tools::getInstance();
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pTVar3->subDirs);
    if (sVar4 <= uVar2) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &this->path,"/");
    pTVar3 = Tools::getInstance();
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(pTVar3->subDirs,(long)local_228);
    std::operator+(&local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   pvVar5);
    std::filesystem::__cxx11::path::path(&local_260,&local_280,auto_format);
    bVar1 = std::filesystem::create_directory(&local_260);
    local_238[0] = bVar1 & 1;
    std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict1 *)local_238);
    std::filesystem::__cxx11::path::~path(&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)local_2a0);
    local_228 = local_228 + 1;
  }
  local_2a4 = 0;
  while( true ) {
    uVar2 = (ulong)local_2a4;
    pTVar3 = Tools::getInstance();
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pTVar3->subDirs);
    if (sVar4 <= uVar2) break;
    std::operator+(&local_2e8,&this->path,"/");
    pTVar3 = Tools::getInstance();
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(pTVar3->subDirs,(long)local_2a4);
    std::operator+(&local_2c8,&local_2e8,pvVar5);
    std::ifstream::open((string *)&i,(_Ios_Openmode)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      pLVar6 = Logger::getInstance();
      pTVar3 = Tools::getInstance();
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(pTVar3->subDirs,(long)local_2a4);
      std::operator+(&local_328,"Directory ",pvVar5);
      std::operator+(&local_308,&local_328," didn\'t create");
      Logger::LogError(pLVar6,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      local_221 = 0;
    }
    local_2a4 = local_2a4 + 1;
  }
  if ((local_221 & 1) != 0) {
    pLVar6 = Logger::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"Directories created successfully",&local_349);
    Logger::LogInformation(pLVar6,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
  }
  bVar1 = local_221;
  std::ifstream::~ifstream(&i);
  return (bool)(bVar1 & 1);
}

Assistant:

bool CreateSubDirs() {
        vector<int> *dirs = new vector<int>{};
        ifstream file;
        bool isCreated = true;
        for (int i = 0; i < Tools::getInstance()->subDirs->size(); i++) {
            dirs->push_back(filesystem::create_directory(this->path + "/" + Tools::getInstance()->subDirs->at(i)));
        }

        for (int i = 0; i < Tools::getInstance()->subDirs->size(); i++) {
            file.open(this->path + "/" + Tools::getInstance()->subDirs->at(i));
            if (!file.is_open()) {
                Logger::getInstance()->LogError(
                        "Directory " + Tools::getInstance()->subDirs->at(i) + " didn't create");
                isCreated = false;
            }
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("Directories created successfully");
        }

        return isCreated;
    }